

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::ConstructSourceFileFlags(cmGeneratorTarget *this)

{
  int iVar1;
  cmValue cVar2;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *relFile;
  pointer pbVar4;
  pointer pbVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_01;
  cmSourceFile *sf;
  cmList relFiles;
  
  if (this->SourceFileFlagsConstructed == false) {
    this->SourceFileFlagsConstructed = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sf,"PUBLIC_HEADER",(allocator<char> *)&relFiles);
    cVar2 = GetProperty(this,(string *)&sf);
    std::__cxx11::string::~string((string *)&sf);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::string((string *)&sf,(string *)cVar2.Value);
      init._M_len = 1;
      init._M_array = (iterator)&sf;
      cmList::cmList(&relFiles,init);
      std::__cxx11::string::~string((string *)&sf);
      pbVar5 = relFiles.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = relFiles.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar5; pbVar4 = pbVar4 + 1
          ) {
        sf = cmMakefile::GetSource(this->Makefile,pbVar4,Ambiguous);
        if (sf != (cmSourceFile *)0x0) {
          pmVar3 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,&sf);
          pmVar3->MacFolder = "Headers";
          pmVar3->Type = SourceFileTypePublicHeader;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&relFiles.Values);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sf,"PRIVATE_HEADER",(allocator<char> *)&relFiles);
    cVar2 = GetProperty(this,(string *)&sf);
    std::__cxx11::string::~string((string *)&sf);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::string((string *)&sf,(string *)cVar2.Value);
      init_00._M_len = 1;
      init_00._M_array = (iterator)&sf;
      cmList::cmList(&relFiles,init_00);
      std::__cxx11::string::~string((string *)&sf);
      pbVar5 = relFiles.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = relFiles.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar5; pbVar4 = pbVar4 + 1
          ) {
        sf = cmMakefile::GetSource(this->Makefile,pbVar4,Ambiguous);
        if (sf != (cmSourceFile *)0x0) {
          pmVar3 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,&sf);
          pmVar3->MacFolder = "PrivateHeaders";
          pmVar3->Type = SourceFileTypePrivateHeader;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&relFiles.Values);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sf,"RESOURCE",(allocator<char> *)&relFiles);
    cVar2 = GetProperty(this,(string *)&sf);
    std::__cxx11::string::~string((string *)&sf);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::string((string *)&sf,(string *)cVar2.Value);
      init_01._M_len = 1;
      init_01._M_array = (iterator)&sf;
      cmList::cmList(&relFiles,init_01);
      std::__cxx11::string::~string((string *)&sf);
      for (pbVar5 = relFiles.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != relFiles.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        sf = cmMakefile::GetSource(this->Makefile,pbVar5,Ambiguous);
        if (sf != (cmSourceFile *)0x0) {
          pmVar3 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,&sf);
          pmVar3->MacFolder = "";
          iVar1 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x32])
                            (this->GlobalGenerator,this->Makefile);
          if ((char)iVar1 == '\0') {
            pmVar3->MacFolder = "Resources";
          }
          pmVar3->Type = SourceFileTypeResource;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&relFiles.Values);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::ConstructSourceFileFlags() const
{
  if (this->SourceFileFlagsConstructed) {
    return;
  }
  this->SourceFileFlagsConstructed = true;

  // Process public headers to mark the source files.
  if (cmValue files = this->GetProperty("PUBLIC_HEADER")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "Headers";
        flags.Type = cmGeneratorTarget::SourceFileTypePublicHeader;
      }
    }
  }

  // Process private headers after public headers so that they take
  // precedence if a file is listed in both.
  if (cmValue files = this->GetProperty("PRIVATE_HEADER")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "PrivateHeaders";
        flags.Type = cmGeneratorTarget::SourceFileTypePrivateHeader;
      }
    }
  }

  // Mark sources listed as resources.
  if (cmValue files = this->GetProperty("RESOURCE")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "";
        if (!this->GlobalGenerator->ShouldStripResourcePath(this->Makefile)) {
          flags.MacFolder = "Resources";
        }
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
      }
    }
  }
}